

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::call_matcher_list<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>::
~call_matcher_list(call_matcher_list<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>
                   *this)

{
  call_matcher_list<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)> *this_local;
  
  ~call_matcher_list(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

void decommission()
    {
      auto lock = get_lock();
      auto iter = this->begin();
      auto const e = this->end();
      while (iter != e)
      {
        auto &m = *iter;
        ++iter; // intrusive list, so must advance to next before destroying
        m.mock_destroyed();
        m.unlink();
      }
    }